

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cpp
# Opt level: O2

bool __thiscall CaDiCaL::Internal::disconnect_proof_tracer(Internal *this,StatTracer *tracer)

{
  StatTracer **ppSVar1;
  __normal_iterator<CaDiCaL::StatTracer_**,_std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>_>
  __position;
  
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<CaDiCaL::StatTracer**,std::vector<CaDiCaL::StatTracer*,std::allocator<CaDiCaL::StatTracer*>>>,__gnu_cxx::__ops::_Iter_equals_val<CaDiCaL::StatTracer*const>>
                         ((this->stat_tracers).
                          super__Vector_base<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->stat_tracers).
                          super__Vector_base<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
  ppSVar1 = (this->stat_tracers).
            super__Vector_base<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != ppSVar1) {
    std::vector<CaDiCaL::StatTracer_*,_std::allocator<CaDiCaL::StatTracer_*>_>::erase
              (&this->stat_tracers,(const_iterator)__position._M_current);
    Proof::disconnect(this->proof,(Tracer *)tracer);
  }
  return __position._M_current != ppSVar1;
}

Assistant:

bool Internal::disconnect_proof_tracer (StatTracer *tracer) {
  auto it = std::find (stat_tracers.begin (), stat_tracers.end (), tracer);
  if (it != stat_tracers.end ()) {
    stat_tracers.erase (it);
    assert (proof);
    proof->disconnect (tracer);
    return true;
  }
  return false;
}